

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL JS_AtomSymbolHasDescription(JSContext *ctx,JSAtom v)

{
  long lVar1;
  BOOL BVar2;
  JSAtom in_ESI;
  long in_RDI;
  JSAtomStruct *p;
  JSRuntime *rt;
  undefined1 local_2a;
  undefined1 local_29;
  undefined4 local_4;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  BVar2 = __JS_AtomIsTaggedInt(in_ESI);
  if (BVar2 == 0) {
    lVar1 = *(long *)(*(long *)(lVar1 + 0x60) + (ulong)in_ESI * 8);
    if ((((uint)((ulong)*(undefined8 *)(lVar1 + 4) >> 0x3e) == 3) &&
        ((*(ulong *)(lVar1 + 4) >> 0x20 & 0x3fffffff) == 0)) ||
       (local_29 = 0, (uint)((ulong)*(undefined8 *)(lVar1 + 4) >> 0x3e) == 2)) {
      local_2a = false;
      if ((*(ulong *)(lVar1 + 4) & 0x7fffffff) == 0) {
        local_2a = (*(ulong *)(lVar1 + 4) >> 0x1f & 1) != 0;
      }
      local_29 = local_2a ^ 0xff;
    }
    local_4 = (uint)(local_29 & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static BOOL JS_AtomSymbolHasDescription(JSContext *ctx, JSAtom v)
{
    JSRuntime *rt;
    JSAtomStruct *p;

    rt = ctx->rt;
    if (__JS_AtomIsTaggedInt(v))
        return FALSE;
    p = rt->atom_array[v];
    return (((p->atom_type == JS_ATOM_TYPE_SYMBOL &&
              p->hash == JS_ATOM_HASH_SYMBOL) ||
             p->atom_type == JS_ATOM_TYPE_GLOBAL_SYMBOL) &&
            !(p->len == 0 && p->is_wide_char != 0));
}